

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

void __thiscall
pybind11::detail::type_record::add_base
          (type_record *this,type_info *base,_func_void_ptr_void_ptr *caster)

{
  char *pcVar1;
  PyTypeObject *local_248;
  allocator local_239;
  string local_238 [32];
  char local_218 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [39];
  allocator local_131;
  string local_130 [8];
  string tname_1;
  allocator local_109;
  string local_108 [32];
  char local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [55];
  allocator local_51;
  string local_50 [8];
  string tname;
  type_index local_30;
  type_info *local_28;
  type_info *base_info;
  _func_void_ptr_void_ptr *caster_local;
  type_info *base_local;
  type_record *this_local;
  
  base_info = (type_info *)caster;
  caster_local = (_func_void_ptr_void_ptr *)base;
  base_local = (type_info *)this;
  std::type_index::type_index(&local_30,base);
  local_28 = get_type_info(&local_30,false);
  if (local_28 == (type_info *)0x0) {
    pcVar1 = std::type_info::name((type_info *)caster_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar1,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    clean_type_id((string *)local_50);
    pcVar1 = this->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,pcVar1,&local_109);
    std::operator+(local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "generic_type: type \"");
    std::operator+(local_c8,local_e8);
    std::operator+(local_a8,local_c8);
    std::operator+(local_88,(char *)local_a8);
    pybind11_fail(local_88);
  }
  if (((byte)this->field_0x58 >> 3 & 1) != ((byte)local_28->field_0x88 >> 2 & 1)) {
    pcVar1 = std::type_info::name((type_info *)caster_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,pcVar1,&local_131);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    clean_type_id((string *)local_130);
    pcVar1 = this->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,pcVar1,&local_239);
    std::operator+(local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "generic_type: type \"");
    std::operator+(local_1f8,local_218);
    std::operator+(local_1d8,(char *)local_1f8);
    std::operator+(local_1b8,(char *)local_1d8);
    std::operator+(local_198,local_1b8);
    std::operator+(local_178,(char *)local_198);
    std::operator+(local_158,(char *)local_178);
    pybind11_fail(local_158);
  }
  local_248 = local_28->type;
  list::append<_object*>(&this->bases,(_object **)&local_248);
  if (local_28->type->tp_dictoffset != 0) {
    this->field_0x58 = this->field_0x58 & 0xfd | 2;
  }
  if (base_info != (type_info *)0x0) {
    std::
    vector<std::pair<std::type_info_const*,void*(*)(void*)>,std::allocator<std::pair<std::type_info_const*,void*(*)(void*)>>>
    ::emplace_back<std::type_info_const*&,void*(*&)(void*)>
              ((vector<std::pair<std::type_info_const*,void*(*)(void*)>,std::allocator<std::pair<std::type_info_const*,void*(*)(void*)>>>
                *)&local_28->implicit_casts,&this->type,(_func_void_ptr_void_ptr **)&base_info);
  }
  return;
}

Assistant:

PYBIND11_NOINLINE void add_base(const std::type_info &base, void *(*caster)(void *)) {
        auto base_info = detail::get_type_info(base, false);
        if (!base_info) {
            std::string tname(base.name());
            detail::clean_type_id(tname);
            pybind11_fail("generic_type: type \"" + std::string(name) +
                          "\" referenced unknown base type \"" + tname + "\"");
        }

        if (default_holder != base_info->default_holder) {
            std::string tname(base.name());
            detail::clean_type_id(tname);
            pybind11_fail("generic_type: type \"" + std::string(name) + "\" " +
                    (default_holder ? "does not have" : "has") +
                    " a non-default holder type while its base \"" + tname + "\" " +
                    (base_info->default_holder ? "does not" : "does"));
        }

        bases.append((PyObject *) base_info->type);

        if (base_info->type->tp_dictoffset != 0)
            dynamic_attr = true;

        if (caster)
            base_info->implicit_casts.emplace_back(type, caster);
    }